

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertUnlinkableCommand
          (CommandRunner *this,AssertUnlinkableCommand *command)

{
  uint32_t uVar1;
  string_view module_filename;
  bool bVar2;
  undefined8 uVar3;
  Trap *this_00;
  Ptr *in_R9;
  string local_d8;
  size_t local_b8;
  undefined1 local_b0 [8];
  Ptr instance;
  Ptr trap;
  RefVec imports;
  undefined1 local_50 [8];
  Ptr module;
  Errors errors;
  AssertUnlinkableCommand *command_local;
  CommandRunner *this_local;
  
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
  module_filename =
       (string_view)
       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&command->filename);
  ReadModule((Ptr *)local_50,this,module_filename,(Errors *)&module.root_index_);
  bVar2 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_50);
  if (bVar2) {
    bVar2 = ValidIR(&command->filename);
    if (bVar2) {
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&trap.root_index_)
      ;
      PopulateImports(this,(Ptr *)local_50,(RefVec *)&trap.root_index_);
      wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
                ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
      local_b8 = (size_t)wabt::interp::RefPtr<wabt::interp::Module>::ref
                                   ((RefPtr<wabt::interp::Module> *)local_50);
      wabt::interp::Instance::Instantiate
                ((Ptr *)local_b0,(Instance *)this,(Store *)local_b8,(Ref)&trap.root_index_,
                 (RefVec *)&instance.root_index_,in_R9);
      bVar2 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)&instance.root_index_);
      if (bVar2) {
        uVar1 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
        this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                            ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
        wabt::interp::Trap::message_abi_cxx11_(&local_d8,this_00);
        uVar3 = std::__cxx11::string::c_str();
        PrintError(this,uVar1,"assert_unlinkable passed:\n  error: %s",uVar3);
        std::__cxx11::string::~string((string *)&local_d8);
        wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        uVar1 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
        uVar3 = std::__cxx11::string::c_str();
        PrintError(this,uVar1,"expected module to be unlinkable: \"%s\"",uVar3);
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr
                ((RefPtr<wabt::interp::Instance> *)local_b0);
      wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr
                ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&trap.root_index_)
      ;
    }
    else {
      uVar1 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
      uVar3 = std::__cxx11::string::c_str();
      PrintError(this,uVar1,"IR Validator thinks module is invalid: \"%s\"",uVar3);
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    uVar1 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"unable to compile unlinkable module: \"%s\"",uVar3);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_50);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertUnlinkableCommand(
    const AssertUnlinkableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile unlinkable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (!ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be unlinkable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: Change to one-line error.
  PrintError(command->line, "assert_unlinkable passed:\n  error: %s",
             trap->message().c_str());
  return wabt::Result::Ok;
}